

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockAddr.cpp
# Opt level: O3

char * AGSSock::SockAddr_get_IP(SockAddr *sa)

{
  sa_family_t sVar1;
  char *pcVar2;
  socklen_t __len;
  int __af;
  char buffer [16];
  char local_38 [48];
  
  sVar1 = (sa->super_sockaddr_storage).ss_family;
  if (sVar1 == 10) {
    local_38[0x20] = '\0';
    local_38[0x21] = '\0';
    local_38[0x22] = '\0';
    local_38[0x23] = '\0';
    local_38[0x24] = '\0';
    local_38[0x25] = '\0';
    local_38[0x26] = '\0';
    local_38[0x27] = '\0';
    local_38[0x28] = '\0';
    local_38[0x29] = '\0';
    local_38[0x2a] = '\0';
    local_38[0x2b] = '\0';
    local_38[0x2c] = '\0';
    local_38[0x2d] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[0x18] = '\0';
    local_38[0x19] = '\0';
    local_38[0x1a] = '\0';
    local_38[0x1b] = '\0';
    local_38[0x1c] = '\0';
    local_38[0x1d] = '\0';
    local_38[0x1e] = '\0';
    local_38[0x1f] = '\0';
    pcVar2 = (sa->super_sockaddr_storage).__ss_padding + 6;
    __af = 10;
    __len = 0x2e;
  }
  else {
    if (sVar1 != 2) {
      return (char *)0x0;
    }
    pcVar2 = (sa->super_sockaddr_storage).__ss_padding + 2;
    __af = 2;
    __len = 0x10;
  }
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  inet_ntop(__af,pcVar2,local_38,__len);
  pcVar2 = (char *)(**(code **)(*AGSSockAPI::engine + 0x248))(AGSSockAPI::engine,local_38);
  return pcVar2;
}

Assistant:

const char *SockAddr_get_IP(SockAddr *sa)
{
	if (sa->ss_family == AF_INET)
	{
		char buffer[INET_ADDRSTRLEN] = "";
		sockaddr_in *addr = reinterpret_cast<sockaddr_in *> (sa);
		inet_ntop(sa->ss_family, &addr->sin_addr, buffer, sizeof (buffer));
		return AGS_STRING(buffer);
	}
	else if (sa->ss_family == AF_INET6)
	{
		char buffer[INET6_ADDRSTRLEN] = "";
		sockaddr_in6 *addr = reinterpret_cast<sockaddr_in6 *> (sa);
		inet_ntop(sa->ss_family, &addr->sin6_addr, buffer, sizeof (buffer));
		return AGS_STRING(buffer);
	}
	return nullptr;
}